

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool __thiscall ON_Font::SetLogfontCharSet(ON_Font *this,uchar logfont_charset)

{
  bool bVar1;
  bool bVar2;
  uchar uVar3;
  undefined7 in_register_00000031;
  
  uVar3 = ((int)CONCAT71(in_register_00000031,logfont_charset) == 2) + '\x01';
  bVar2 = true;
  if (uVar3 != this->m_logfont_charset) {
    bVar1 = ModificationPermitted
                      (this,"",
                       "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                       ,0x2f00);
    if (bVar1) {
      this->m_logfont_charset = uVar3;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ON_Font::SetLogfontCharSet(unsigned char logfont_charset)
{
  if (ON_Font::WindowsConstants::logfont_symbol_charset != logfont_charset)
    logfont_charset = ON_Font::WindowsConstants::logfont_default_charset;
  if(logfont_charset != m_logfont_charset)
  {
    if ( false == ON_FONT_MODIFICATION_PERMITTED )
      return false;
    m_logfont_charset = logfont_charset;
  }
  return true;
}